

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMini.c
# Opt level: O3

void * Abc_FrameGiaOutputMiniAig(Abc_Frame_t *pAbc)

{
  Gia_Man_t *pGia;
  Mini_Aig_t *pMVar1;
  
  if (pAbc == (Abc_Frame_t *)0x0) {
    puts("ABC framework is not initialized by calling Abc_Start()");
  }
  pGia = Abc_FrameReadGia(pAbc);
  if (pGia == (Gia_Man_t *)0x0) {
    puts("Current network in ABC framework is not defined.");
    pGia = (Gia_Man_t *)0x0;
  }
  pMVar1 = Gia_ManToMiniAig(pGia);
  return pMVar1;
}

Assistant:

void * Abc_FrameGiaOutputMiniAig( Abc_Frame_t * pAbc )
{
    Gia_Man_t * pGia;
    if ( pAbc == NULL )
        printf( "ABC framework is not initialized by calling Abc_Start()\n" );
    pGia = Abc_FrameReadGia( pAbc );
    if ( pGia == NULL )
        printf( "Current network in ABC framework is not defined.\n" );
    return Gia_ManToMiniAig( pGia );
}